

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

string * __thiscall
filesystem::path::extension_abi_cxx11_(string *__return_storage_ptr__,path *this)

{
  long lVar1;
  allocator<char> local_31;
  string local_30;
  
  filename_abi_cxx11_(&local_30,this);
  lVar1 = std::__cxx11::string::find_last_of((char *)&local_30,0x6c19f1);
  if (lVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_31);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_30);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string extension() const {
        const std::string &name = filename();
        size_t pos = name.find_last_of(".");
        if (pos == std::string::npos)
            return "";
        return name.substr(pos+1);
    }